

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O0

void __thiscall
bp_osd::bp_osd(bp_osd *this,mod2sparse *H,double channel_prob,int max_iter,double osd_order,
              int osd_method,int bp_method)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  char *pcVar7;
  unsigned_long_long uVar8;
  ostream *poVar9;
  int in_ECX;
  int in_EDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_XMM0_Qa;
  __type _Var10;
  double in_XMM1_Qa;
  int w2_count_1;
  int j;
  int i_2;
  int i_1;
  int w2_count;
  int total_count;
  int i;
  double in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int __x;
  undefined8 in_stack_ffffffffffffff50;
  mod2sparse *in_stack_ffffffffffffff90;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  
  __x = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  *in_RDI = in_RSI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_RSI[1];
  *(undefined4 *)(in_RDI + 1) = *in_RSI;
  iVar4 = mod2sparse_rank(in_stack_ffffffffffffff90);
  *(int *)(in_RDI + 2) = iVar4;
  *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0xc) - *(int *)(in_RDI + 2);
  in_RDI[4] = in_XMM0_Qa;
  if (in_EDX == 0) {
    *(undefined4 *)(in_RDI + 5) = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else if (*(int *)((long)in_RDI + 0xc) < in_EDX) {
    *(undefined4 *)(in_RDI + 5) = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    *(int *)(in_RDI + 5) = in_EDX;
  }
  *(undefined4 *)(in_RDI + 8) = in_R8D;
  *(int *)((long)in_RDI + 0x44) = (int)in_XMM1_Qa;
  *(int *)(in_RDI + 9) = in_ECX;
  iVar4 = *(int *)((long)in_RDI + 0xc);
  pvVar5 = operator_new__((long)iVar4);
  memset(pvVar5,0,(long)iVar4);
  in_RDI[10] = pvVar5;
  iVar4 = *(int *)((long)in_RDI + 0xc);
  pvVar5 = operator_new__((long)iVar4);
  memset(pvVar5,0,(long)iVar4);
  in_RDI[0xb] = pvVar5;
  iVar4 = *(int *)((long)in_RDI + 0xc);
  pvVar5 = operator_new__((long)iVar4);
  memset(pvVar5,0,(long)iVar4);
  in_RDI[0xc] = pvVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)((long)in_RDI + 0xc);
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar6);
  memset(pvVar5,0,uVar6);
  in_RDI[3] = pvVar5;
  pvVar5 = operator_new__(4);
  memset(pvVar5,0,4);
  in_RDI[7] = pvVar5;
  pvVar5 = operator_new__(4);
  memset(pvVar5,0,4);
  in_RDI[6] = pvVar5;
  if (in_ECX == 0) {
    _Var10 = std::pow<int,double>(__x,in_stack_ffffffffffffff38);
    in_RDI[0xe] = (long)_Var10 | (long)(_Var10 - 9.223372036854776e+18) & (long)_Var10 >> 0x3f;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_RDI[0xe];
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar6);
    in_RDI[0xd] = pvVar5;
    for (local_34 = 0; (ulong)(long)local_34 < (ulong)in_RDI[0xe]; local_34 = local_34 + 1) {
      pcVar7 = decimal_to_binary_reverse
                         ((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                          (int)in_stack_ffffffffffffff50);
      *(char **)(in_RDI[0xd] + (long)local_34 * 8) = pcVar7;
    }
  }
  else if (in_ECX == 1) {
    local_38 = 0;
    uVar8 = ncr((int)in_XMM1_Qa,2);
    in_RDI[0xe] = (long)(*(int *)((long)in_RDI + 0x14) + (int)uVar8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RDI[0xe];
    uVar6 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar6);
    in_RDI[0xd] = pvVar5;
    for (local_40 = 0; local_40 < *(int *)((long)in_RDI + 0x14); local_40 = local_40 + 1) {
      iVar4 = *(int *)((long)in_RDI + 0x14);
      pvVar5 = operator_new__((long)iVar4);
      memset(pvVar5,0,(long)iVar4);
      *(void **)(in_RDI[0xd] + (long)local_38 * 8) = pvVar5;
      *(undefined1 *)(*(long *)(in_RDI[0xd] + (long)local_38 * 8) + (long)local_40) = 1;
      local_38 = local_38 + 1;
    }
    for (local_44 = 0; (double)local_44 < in_XMM1_Qa; local_44 = local_44 + 1) {
      for (local_48 = 0; (double)local_48 < in_XMM1_Qa; local_48 = local_48 + 1) {
        if (local_44 < local_48) {
          uVar6 = (ulong)*(int *)((long)in_RDI + 0x14);
          pvVar5 = operator_new__(uVar6);
          memset(pvVar5,0,uVar6);
          *(void **)(in_RDI[0xd] + (long)local_38 * 8) = pvVar5;
          *(undefined1 *)(*(long *)(in_RDI[0xd] + (long)local_38 * 8) + (long)local_44) = 1;
          *(undefined1 *)(*(long *)(in_RDI[0xd] + (long)local_38 * 8) + (long)local_48) = 1;
          local_38 = local_38 + 1;
        }
      }
    }
  }
  else if (in_ECX != 2) {
    if (in_ECX != 3) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "ERROR. Function <bp_osd::constructor>. OSD Method ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,in_ECX);
      poVar9 = std::operator<<(poVar9," not valid");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      exit(0x16);
    }
    uVar8 = ncr((int)in_XMM1_Qa,2);
    in_RDI[0xe] = (long)(*(int *)((long)in_RDI + 0x14) + (int)uVar8);
  }
  return;
}

Assistant:

bp_osd::bp_osd(mod2sparse *H, double channel_prob, int max_iter, double osd_order,int osd_method, int bp_method){

    this->H=H;
    this->N=mod2sparse_cols(H);
    this->M=mod2sparse_rows(H);

    this->rank=mod2sparse_rank(H);
    this->K=N-rank;

    this->channel_prob=channel_prob;

    if(max_iter==0){this->max_iter=N;}
    else if(max_iter>N){this->max_iter=N;}
    else{this->max_iter=max_iter;}

    this->bp_method=bp_method;

    this->osd_order=osd_order;
    this->osd_method=osd_method;
    this->bp_decoding=new char[N]();
    this->osd0_decoding=new char[N]();
    this->osdw_decoding=new char[N]();
    this->log_prob_ratios=new double[N]();
    this->converge=new int[1]();
    this->iter=new int[1]();

    if(osd_method==0) {
        assert(osd_order<=N-rank);
        this->encoding_input_count=pow(2,osd_order);
        this->osd_w_encoding_inputs = new char*[encoding_input_count];
        for(int i = 0; i < encoding_input_count; ++i)
            osd_w_encoding_inputs[i] = decimal_to_binary_reverse(i, N - rank);
        }
    else if(osd_method==1){
        assert(osd_order<=K);
        int total_count=0;
        int w2_count=ncr(osd_order,2);
        this->encoding_input_count = K+w2_count;

        this->osd_w_encoding_inputs = new char*[encoding_input_count];
        for(int i=0;i<K;i++){
            osd_w_encoding_inputs[total_count]=new char[K]();
            osd_w_encoding_inputs[total_count][i]=1;
            total_count++;
        }
        for(int i=0;i<osd_order;i++){
            for(int j=0;j<osd_order;j++){
                if(i<j){
                    osd_w_encoding_inputs[total_count]=new char[K]();
                    osd_w_encoding_inputs[total_count][i]=1;
                    osd_w_encoding_inputs[total_count][j]=1;
                    total_count++;
                }
            }
        }
        assert(total_count==this->encoding_input_count);

    }
    else if(osd_method==2) 1;
    else if(osd_method==3){
        assert(osd_order<=K);
        int w2_count=ncr(osd_order,2);
        this->encoding_input_count = K+w2_count;
    }

    else{
        cout<<"ERROR. Function <bp_osd::constructor>. OSD Method "<<osd_method<< " not valid"<<endl;
        exit(22);
    }

}